

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O3

void __thiscall
deqp::gls::StateChangePerformanceCase::requireSamplers(StateChangePerformanceCase *this,int count)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  iterator __position;
  int iVar1;
  deUint32 err;
  undefined8 in_RAX;
  undefined4 extraout_var;
  uint *puVar2;
  GLuint sampler;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  if ((int)((ulong)((long)(this->m_samplers).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->m_samplers).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2) < count) {
    this_00 = &this->m_samplers;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(this_00,(long)count);
    if ((int)((ulong)((long)(this->m_samplers).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->m_samplers).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) < count) {
      do {
        (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6f0))(1,(uint *)((long)&uStack_38 + 4));
        err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
        glu::checkError(err,"glGenSamplers()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                        ,0x1c8);
        __position._M_current =
             (this->m_samplers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_samplers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,__position,
                     (uint *)((long)&uStack_38 + 4));
          puVar2 = (this->m_samplers).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        else {
          *__position._M_current = uStack_38._4_4_;
          puVar2 = __position._M_current + 1;
          (this->m_samplers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_finish = puVar2;
        }
      } while ((int)((ulong)((long)puVar2 -
                            (long)(this_00->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_start) >> 2) < count);
    }
  }
  return;
}

Assistant:

void StateChangePerformanceCase::requireSamplers (int count)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	if ((int)m_samplers.size() >= count)
		return;

	m_samplers.reserve(count);

	while ((int)m_samplers.size() < count)
	{
		GLuint sampler;
		gl.genSamplers(1, &sampler);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenSamplers()");
		m_samplers.push_back(sampler);
	}
}